

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_todayqps_by_region.cc
# Opt level: O2

int __thiscall
aliyun::Yundun::TodayqpsByRegion
          (Yundun *this,YundunTodayqpsByRegionResponseType *response,YundunErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  Value val;
  value_type local_2f0;
  string str_response;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"TodayqpsByRegion",(allocator<char> *)&local_2a0);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"RegionId",(allocator<char> *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,this->region_id_,(allocator<char> *)&local_2a0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_2f0.region_id,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,anon_var_dwarf_b652f + 9,&local_309);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_2f0.region_id,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,anon_var_dwarf_b652f + 9,&local_30a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_2f0.region_id,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,anon_var_dwarf_b652f + 9,&local_30b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_2f0.region_id,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,anon_var_dwarf_b652f + 9,&local_30c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      if (response != (YundunTodayqpsByRegionResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar5,"Region");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Data");
            pVVar5 = Json::Value::operator[](pVVar5,"Region");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              index = 0;
              while( true ) {
                iVar2 = 200;
                AVar3 = Json::Value::size(pVVar5);
                if (AVar3 <= index) break;
                local_2f0.region_id._M_dataplus._M_p = (pointer)&local_2f0.region_id.field_2;
                local_2f0.region_id._M_string_length = 0;
                local_2f0.region_id.field_2._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"RegionId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_2a0,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2a0);
                  std::__cxx11::string::~string((string *)&local_2a0);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RegionNumber");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RegionNumber");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_2f0.region_number = (long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar6,"RegionFlow");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"RegionFlow");
                  IVar4 = Json::Value::asInt(pVVar6);
                  local_2f0.region_flow = (long)IVar4;
                }
                std::
                vector<aliyun::YundunTodayqpsByRegionRegionType,_std::allocator<aliyun::YundunTodayqpsByRegionRegionType>_>
                ::push_back(&response->data,&local_2f0);
                std::__cxx11::string::~string((string *)&local_2f0);
                index = index + 1;
              }
            }
          }
        }
      }
      goto LAB_0012b876;
    }
  }
  iVar2 = -1;
  if (error_info != (YundunErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012b876:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Yundun::TodayqpsByRegion(YundunTodayqpsByRegionResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","TodayqpsByRegion");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}